

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O3

void __thiscall Hpipe::Instruction::update_in_a_branch(Instruction *this)

{
  long lVar1;
  pointer pTVar2;
  long *plVar3;
  long *plVar4;
  Instruction *inst;
  Vec<Hpipe::Instruction_*> *__range1;
  Vec<Hpipe::Instruction_*> tails;
  long *local_48;
  long *plStack_40;
  long local_38;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = &local_48;
  local_48 = (long *)0x0;
  plStack_40 = (long *)0x0;
  local_38 = 0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/Instruction.cpp:466:12)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/Instruction.cpp:466:12)>
             ::_M_manager;
  apply(this,(function<void_(Hpipe::Instruction_*)> *)&local_28,false);
  plVar3 = local_48;
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
    plVar3 = local_48;
  }
  for (; plVar4 = plVar3, plVar3 != plStack_40; plVar3 = plVar3 + 1) {
    do {
      lVar1 = *plVar4;
      if (*(char *)(lVar1 + 0xcc) == '\0') break;
      *(undefined1 *)(lVar1 + 0xcc) = 0;
      plVar4 = *(long **)(lVar1 + 0xb0);
    } while (*(long *)(lVar1 + 0xb8) - (long)*(long **)(lVar1 + 0xb0) == 0x28);
  }
  while (this->in_a_branch != false) {
    this->in_a_branch = false;
    pTVar2 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
              super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pTVar2 != 0x28) break;
    this = pTVar2->inst;
  }
  if (local_48 != (long *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return;
}

Assistant:

void Instruction::update_in_a_branch() {
    Vec<Instruction *> tails;
    apply( [&]( Instruction *inst ) {
        inst->in_a_branch = true;
        if ( inst->next.empty() )
            tails << inst;
    } );

    // tails
    for( Instruction *inst : tails ) {
        while( true ) {
            if ( inst->in_a_branch == false )
                break;
            inst->in_a_branch = false;
            if ( inst->prev.size() != 1 )
                break;
            inst = inst->prev[ 0 ].inst;
        }
    }

    // head
    for( Instruction *inst = this; ; ) {
        if ( inst->in_a_branch == false )
            break;
        inst->in_a_branch = false;
        if ( inst->next.size() != 1 )
            break;
        inst = inst->next[ 0 ].inst;
    }
}